

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O2

bool can_live_in(CHAR_DATA *ch,int hometown)

{
  bool bVar1;
  int iVar2;
  
  if (hometown - 6U < 0xfffffffb) {
    return false;
  }
  iVar2 = hometown_table[(uint)hometown].align;
  if (iVar2 != -1) {
    if (iVar2 == 1) {
      bVar1 = is_evil(ch);
      if (bVar1) {
        return false;
      }
      iVar2 = hometown_table[(uint)hometown].align;
    }
    if (iVar2 == 2) {
      bVar1 = is_good(ch);
      if (bVar1) {
        return false;
      }
      iVar2 = hometown_table[(uint)hometown].align;
    }
    if (iVar2 == 4) {
      bVar1 = is_good(ch);
      if (!bVar1) {
        return false;
      }
      iVar2 = hometown_table[(uint)hometown].align;
    }
    if (iVar2 == 5) {
      bVar1 = is_neutral(ch);
      if (!bVar1) {
        return false;
      }
      iVar2 = hometown_table[(uint)hometown].align;
    }
    if (iVar2 == 6) {
      bVar1 = is_evil(ch);
      if (!bVar1) {
        return false;
      }
      iVar2 = hometown_table[(uint)hometown].align;
    }
    if (((iVar2 != 3) || (bVar1 = is_neutral(ch), !bVar1)) &&
       (iVar2 = hometown_table[(uint)hometown].ethos, iVar2 != -1)) {
      if (iVar2 == 1) {
        bVar1 = is_chaotic(ch);
        if (bVar1) {
          return false;
        }
        iVar2 = hometown_table[(uint)hometown].ethos;
      }
      if (iVar2 == 2) {
        bVar1 = is_lawful(ch);
        if (bVar1) {
          return false;
        }
        iVar2 = hometown_table[(uint)hometown].ethos;
      }
      if (iVar2 == 4) {
        bVar1 = is_lawful(ch);
        if (!bVar1) {
          return false;
        }
        iVar2 = hometown_table[(uint)hometown].ethos;
      }
      if (iVar2 == 5) {
        bVar1 = is_eneutral(ch);
        if (!bVar1) {
          return false;
        }
        iVar2 = hometown_table[(uint)hometown].ethos;
      }
      if (iVar2 == 6) {
        bVar1 = is_chaotic(ch);
        if (!bVar1) {
          return false;
        }
        iVar2 = hometown_table[(uint)hometown].ethos;
      }
      if ((iVar2 != 3) || (bVar1 = is_eneutral(ch), !bVar1)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool can_live_in(CHAR_DATA *ch, int hometown)
{
	if (hometown > MAX_HOMETOWN || hometown <= 0)
		return false;

	if (hometown_table[hometown].align == ALIGN_NONE
		|| hometown_table[hometown].align == ALIGN_GN && is_evil(ch)
		|| hometown_table[hometown].align == ALIGN_NE && is_good(ch)
		|| hometown_table[hometown].align == ALIGN_G && !is_good(ch)
		|| hometown_table[hometown].align == ALIGN_N && !is_neutral(ch)
		|| hometown_table[hometown].align == ALIGN_E && !is_evil(ch)
		|| hometown_table[hometown].align == ALIGN_GE && is_neutral(ch))
	{
		return false;
	}

	if (hometown_table[hometown].ethos == ETHOS_NONE
		|| hometown_table[hometown].ethos == ETHOS_LN && is_chaotic(ch)
		|| hometown_table[hometown].ethos == ETHOS_NC && is_lawful(ch)
		|| hometown_table[hometown].ethos == ETHOS_L && !is_lawful(ch)
		|| hometown_table[hometown].ethos == ETHOS_N && !is_eneutral(ch)
		|| hometown_table[hometown].ethos == ETHOS_C && !is_chaotic(ch)
		|| hometown_table[hometown].ethos == ETHOS_LC && is_eneutral(ch))
	{
		return false;
	}

	return true;
}